

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode curl_ws_send(CURL *data,void *buffer,size_t buflen,size_t *sent,curl_off_t fragsize,
                     uint flags)

{
  ssize_t ws_00;
  void *pvVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t *psVar4;
  byte local_7a;
  byte local_79;
  CURLcode local_64;
  size_t *psStack_60;
  CURLcode result;
  size_t payload_added;
  size_t space;
  ssize_t n;
  websocket *ws;
  curl_off_t cStack_38;
  uint flags_local;
  curl_off_t fragsize_local;
  size_t *sent_local;
  size_t buflen_local;
  void *buffer_local;
  CURL *data_local;
  
  ws._4_4_ = flags;
  cStack_38 = fragsize;
  fragsize_local = (curl_off_t)sent;
  sent_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = data;
  if ((((data != (CURL *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    Curl_trc_ws(data,"curl_ws_send(len=%zu, fragsize=%ld, flags=%x), raw=%d",buflen,fragsize,
                (ulong)flags,
                (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x35) & 1));
  }
  *(undefined8 *)fragsize_local = 0;
  if ((*(long *)((long)buffer_local + 0x18) == 0) && (*(char *)((long)buffer_local + 0xa99) != '\0')
     ) {
    local_64 = Curl_connect_only_attach((Curl_easy *)buffer_local);
    if (local_64 != CURLE_OK) goto LAB_001a8fa2;
    local_64 = CURLE_OK;
  }
  if (*(long *)((long)buffer_local + 0x18) == 0) {
    Curl_failf((Curl_easy *)buffer_local,"No associated connection");
    local_64 = CURLE_SEND_ERROR;
    goto LAB_001a8fa2;
  }
  if (*(long *)(*(long *)((long)buffer_local + 0x18) + 0x440) == 0) {
    Curl_failf((Curl_easy *)buffer_local,"Not a websocket transfer");
    local_64 = CURLE_SEND_ERROR;
    goto LAB_001a8fa2;
  }
  n = *(undefined8 *)(*(long *)((long)buffer_local + 0x18) + 0x440);
  local_64 = ws_flush((Curl_easy *)buffer_local,(websocket *)n,false);
  if (local_64 != CURLE_OK) goto LAB_001a8fa2;
  if ((*(ulong *)((long)buffer_local + 0xa9a) >> 0x35 & 1) != 0) {
    if ((cStack_38 != 0) || (ws._4_4_ != 0)) {
      Curl_failf((Curl_easy *)buffer_local,
                 "ws_send, raw mode: fragsize and flags cannot be non-zero");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    local_64 = ws_send_raw((CURL *)buffer_local,(void *)buflen_local,(size_t)sent_local,
                           (size_t *)fragsize_local);
    goto LAB_001a8fa2;
  }
  payload_added = Curl_bufq_space((bufq *)(n + 0x98));
  pvVar1 = buffer_local;
  psVar4 = sent_local;
  if ((((buffer_local != (void *)0x0) && ((*(ulong *)((long)buffer_local + 0xa9a) >> 0x1c & 1) != 0)
       ) && ((*(long *)((long)buffer_local + 0x1328) == 0 ||
             (0 < *(int *)(*(long *)((long)buffer_local + 0x1328) + 8))))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    sVar3 = Curl_bufq_len((bufq *)(n + 0x98));
    Curl_trc_ws((Curl_easy *)pvVar1,"curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",psVar4,sVar3
                ,payload_added);
  }
  if (payload_added < 0xe) {
    local_64 = CURLE_AGAIN;
    goto LAB_001a8fa2;
  }
  if ((ws._4_4_ & 0x20) == 0) {
    if (*(long *)(n + 0x40) == 0) {
      space = ws_enc_write_head((Curl_easy *)buffer_local,(ws_encoder *)(n + 0x38),ws._4_4_,
                                (curl_off_t)sent_local,(bufq *)(n + 0x98),&local_64);
      goto joined_r0x001a8dbf;
    }
  }
  else if (cStack_38 == 0) {
    if ((((*(long *)(n + 0x40) < (long)sent_local) && (buffer_local != (void *)0x0)) &&
        ((*(ulong *)((long)buffer_local + 0xa9a) >> 0x1c & 1) != 0)) &&
       ((*(long *)((long)buffer_local + 0x1328) == 0 ||
        (0 < *(int *)(*(long *)((long)buffer_local + 0x1328) + 8))))) {
      Curl_infof((Curl_easy *)buffer_local,"WS: unaligned frame size (sending %zu instead of %ld)",
                 sent_local,*(undefined8 *)(n + 0x40));
    }
  }
  else {
    space = ws_enc_write_head((Curl_easy *)buffer_local,(ws_encoder *)(n + 0x38),ws._4_4_,cStack_38,
                              (bufq *)(n + 0x98),&local_64);
joined_r0x001a8dbf:
    if ((long)space < 0) goto LAB_001a8fa2;
  }
  space = ws_enc_write_payload
                    ((ws_encoder *)(n + 0x38),(Curl_easy *)buffer_local,(uchar *)buflen_local,
                     (size_t)sent_local,(bufq *)(n + 0x98),&local_64);
  psVar4 = (size_t *)space;
  if (-1 < (long)space) {
    while( true ) {
      do {
        while( true ) {
          psStack_60 = psVar4;
          local_79 = 0;
          if (local_64 == CURLE_OK) {
            local_7a = 1;
            if (sent_local == (size_t *)0x0) {
              _Var2 = Curl_bufq_is_empty((bufq *)(n + 0x98));
              local_7a = _Var2 ^ 0xff;
            }
            local_79 = local_7a;
          }
          pvVar1 = buffer_local;
          ws_00 = n;
          if ((local_79 & 1) == 0) goto LAB_001a8fa2;
          _Var2 = Curl_is_in_callback((Curl_easy *)buffer_local);
          local_64 = ws_flush((Curl_easy *)pvVar1,(websocket *)ws_00,_Var2);
          if (local_64 != CURLE_OK) break;
          *(long *)fragsize_local = (long)psStack_60 + *(long *)fragsize_local;
          buflen_local = buflen_local + (long)psStack_60;
          sent_local = (size_t *)((long)sent_local - (long)psStack_60);
          psStack_60 = (size_t *)0x0;
          psVar4 = psStack_60;
          if (sent_local != (size_t *)0x0) {
            space = ws_enc_write_payload
                              ((ws_encoder *)(n + 0x38),(Curl_easy *)buffer_local,
                               (uchar *)buflen_local,(size_t)sent_local,(bufq *)(n + 0x98),&local_64
                              );
            if ((long)space < 0) goto LAB_001a8fa2;
            psVar4 = (size_t *)Curl_bufq_len((bufq *)(n + 0x98));
          }
        }
        psVar4 = psStack_60;
      } while (local_64 != CURLE_AGAIN);
      if (psStack_60 < sent_local) {
        *(size_t **)fragsize_local = psStack_60;
        local_64 = CURLE_OK;
        goto LAB_001a8fa2;
      }
      if (sent_local == (size_t *)0x0) break;
      *(ulong *)fragsize_local = (long)psStack_60 - 1;
      local_64 = Curl_bufq_unwrite((bufq *)(n + 0x98),1);
      psVar4 = psStack_60;
      if (local_64 == CURLE_OK) {
        local_64 = CURLE_AGAIN;
      }
    }
    *(size_t *)fragsize_local = space;
    local_64 = ws_flush((Curl_easy *)buffer_local,(websocket *)n,true);
  }
LAB_001a8fa2:
  if ((((buffer_local != (void *)0x0) && ((*(ulong *)((long)buffer_local + 0xa9a) >> 0x1c & 1) != 0)
       ) && ((*(long *)((long)buffer_local + 0x1328) == 0 ||
             (0 < *(int *)(*(long *)((long)buffer_local + 0x1328) + 8))))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    Curl_trc_ws((Curl_easy *)buffer_local,
                "curl_ws_send(len=%zu, fragsize=%ld, flags=%x, raw=%d) -> %d, %zu",sent_local,
                cStack_38,(ulong)ws._4_4_,
                (ulong)((uint)((ulong)*(undefined8 *)((long)buffer_local + 0xa9a) >> 0x35) & 1),
                local_64,*(undefined8 *)fragsize_local);
  }
  return local_64;
}

Assistant:

CURL_EXTERN CURLcode curl_ws_send(CURL *data, const void *buffer,
                                  size_t buflen, size_t *sent,
                                  curl_off_t fragsize,
                                  unsigned int flags)
{
  struct websocket *ws;
  ssize_t n;
  size_t space, payload_added;
  CURLcode result;

  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x), raw=%d",
              buflen, fragsize, flags, data->set.ws_raw_mode);
  *sent = 0;
  if(!data->conn && data->set.connect_only) {
    result = Curl_connect_only_attach(data);
    if(result)
      goto out;
  }
  if(!data->conn) {
    failf(data, "No associated connection");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  if(!data->conn->proto.ws) {
    failf(data, "Not a websocket transfer");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  ws = data->conn->proto.ws;

  /* try flushing any content still waiting to be sent. */
  result = ws_flush(data, ws, FALSE);
  if(result)
    goto out;

  if(data->set.ws_raw_mode) {
    /* In raw mode, we write directly to the connection */
    if(fragsize || flags) {
      failf(data, "ws_send, raw mode: fragsize and flags cannot be non-zero");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    result = ws_send_raw(data, buffer, buflen, sent);
    goto out;
  }

  /* Not RAW mode, buf we do the frame encoding */
  space = Curl_bufq_space(&ws->sendbuf);
  CURL_TRC_WS(data, "curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",
              buflen, Curl_bufq_len(&ws->sendbuf), space);
  if(space < 14) {
    result = CURLE_AGAIN;
    goto out;
  }

  if(flags & CURLWS_OFFSET) {
    if(fragsize) {
      /* a frame series 'fragsize' bytes big, this is the first */
      n = ws_enc_write_head(data, &ws->enc, flags, fragsize,
                            &ws->sendbuf, &result);
      if(n < 0)
        goto out;
    }
    else {
      if((curl_off_t)buflen > ws->enc.payload_remain) {
        infof(data, "WS: unaligned frame size (sending %zu instead of %"
                    FMT_OFF_T ")",
              buflen, ws->enc.payload_remain);
      }
    }
  }
  else if(!ws->enc.payload_remain) {
    n = ws_enc_write_head(data, &ws->enc, flags, (curl_off_t)buflen,
                          &ws->sendbuf, &result);
    if(n < 0)
      goto out;
  }

  n = ws_enc_write_payload(&ws->enc, data,
                           buffer, buflen, &ws->sendbuf, &result);
  if(n < 0)
    goto out;
  payload_added = (size_t)n;

  while(!result && (buflen || !Curl_bufq_is_empty(&ws->sendbuf))) {
    /* flush, blocking when in callback */
    result = ws_flush(data, ws, Curl_is_in_callback(data));
    if(!result) {
      DEBUGASSERT(payload_added <= buflen);
      /* all buffered data sent. Try sending the rest if there is any. */
      *sent += payload_added;
      buffer = (const char *)buffer + payload_added;
      buflen -= payload_added;
      payload_added = 0;
      if(buflen) {
        n = ws_enc_write_payload(&ws->enc, data,
                                 buffer, buflen, &ws->sendbuf, &result);
        if(n < 0)
          goto out;
        payload_added = Curl_bufq_len(&ws->sendbuf);
      }
    }
    else if(result == CURLE_AGAIN) {
      /* partially sent. how much of the call data has been part of it? what
      * should we report to out caller so it can retry/send the rest? */
      if(payload_added < buflen) {
        /* We did not add everything the caller wanted. Return just
         * the partial write to our buffer. */
        *sent = payload_added;
        result = CURLE_OK;
        goto out;
      }
      else if(!buflen) {
        /* We have no payload to report a partial write. EAGAIN would make
         * the caller repeat this and add the frame again.
         * Flush blocking seems the only way out of this. */
        *sent = (size_t)n;
        result = ws_flush(data, ws, TRUE);
        goto out;
      }
      /* We added the complete data to our sendbuf. Report one byte less as
       * sent. This partial success should make the caller invoke us again
       * with the last byte. */
      *sent = payload_added - 1;
      result = Curl_bufq_unwrite(&ws->sendbuf, 1);
      if(!result)
        result = CURLE_AGAIN;
    }
  }

out:
  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x, raw=%d) -> %d, %zu",
              buflen, fragsize, flags, data->set.ws_raw_mode, result, *sent);
  return result;
}